

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

termline * lineptr(Terminal *term,wchar_t y,wchar_t lineno,wchar_t screen)

{
  tree234 *ptVar1;
  int iVar2;
  termline *line;
  char *varname;
  wchar_t wVar3;
  tree234 *t;
  
  if (y < L'\0') {
    if (screen != L'\0') {
      __assert_fail("!screen",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x45e,"termline *lineptr(Terminal *, int, int, int)");
    }
    wVar3 = L'\0';
    if (((term->erase_to_scrollback == true) && (wVar3 = L'\0', term->alt_which != L'\0')) &&
       (term->alt_screen != (tree234 *)0x0)) {
      wVar3 = term->alt_sblines;
    }
    if (y < -wVar3) {
      t = term->scrollback;
      iVar2 = count234(t);
      wVar3 = iVar2 + wVar3 + y;
    }
    else {
      t = term->alt_screen;
      wVar3 = term->alt_sblines + y;
    }
  }
  else {
    t = term->screen;
    wVar3 = y;
  }
  ptVar1 = term->scrollback;
  line = (termline *)index234(t,wVar3);
  if (t == ptVar1) {
    if (line == (termline *)0x0) {
      varname = "cline";
      goto LAB_00108f40;
    }
    line = decompressline((compressed_scrollback_line *)line);
  }
  if (line != (termline *)0x0) {
    if (line->cols < term->cols) {
      resizeline(term,line,term->cols);
    }
    return line;
  }
  varname = "line";
LAB_00108f40:
  null_line_error(term,y,lineno,t,wVar3,varname);
}

Assistant:

static termline *lineptr(Terminal *term, int y, int lineno, int screen)
{
    termline *line;
    tree234 *whichtree;
    int treeindex;

    if (y >= 0) {
        whichtree = term->screen;
        treeindex = y;
    } else {
        int altlines = 0;

        assert(!screen);

        if (term->erase_to_scrollback &&
            term->alt_which && term->alt_screen) {
            altlines = term->alt_sblines;
        }
        if (y < -altlines) {
            whichtree = term->scrollback;
            treeindex = y + altlines + count234(term->scrollback);
        } else {
            whichtree = term->alt_screen;
            treeindex = y + term->alt_sblines;
            /* treeindex = y + count234(term->alt_screen); */
        }
    }
    if (whichtree == term->scrollback) {
        compressed_scrollback_line *cline = index234(whichtree, treeindex);
        if (!cline)
            null_line_error(term, y, lineno, whichtree, treeindex, "cline");
        line = decompressline(cline);
    } else {
        line = index234(whichtree, treeindex);
    }

    /* We assume that we don't screw up and retrieve something out of range. */
    if (line == NULL)
        null_line_error(term, y, lineno, whichtree, treeindex, "line");
    assert(line != NULL);

    /*
     * Here we resize lines to _at least_ the right length, but we
     * don't truncate them. Truncation is done as a side effect of
     * modifying the line.
     *
     * The point of this policy is to try to arrange that resizing the
     * terminal window repeatedly - e.g. successive steps in an X11
     * opaque window-resize drag, or resizing as a side effect of
     * retiling by tiling WMs such as xmonad - does not throw away
     * data gratuitously. Specifically, we want a sequence of resize
     * operations with no terminal output between them to have the
     * same effect as a single resize to the ultimate terminal size,
     * and also (for the case in which xmonad narrows a window that's
     * scrolling things) we want scrolling up new text at the bottom
     * of a narrowed window to avoid truncating lines further up when
     * the window is re-widened.
     */
    if (term->cols > line->cols)
        resizeline(term, line, term->cols);

    return line;
}